

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  char *pcVar1;
  uint uVar2;
  ImFontConfig *pIVar3;
  void *ptr;
  ImFont **ppIVar4;
  ImFont *pIVar5;
  ImFontConfig *pIVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int i;
  long lVar10;
  long lVar11;
  
  lVar11 = 0;
  for (lVar10 = 0; lVar8 = (long)(this->ConfigData).Size, lVar10 < lVar8; lVar10 = lVar10 + 1) {
    pIVar3 = (this->ConfigData).Data;
    ptr = *(void **)(pIVar3->Name + lVar11 + -0x56);
    if ((ptr != (void *)0x0) && (pIVar3->Name[lVar11 + -0x4a] == '\x01')) {
      ImGui::MemFree(ptr);
      pcVar1 = ((this->ConfigData).Data)->Name + lVar11 + -0x56;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
    lVar11 = lVar11 + 0x88;
  }
  uVar2 = (this->Fonts).Size;
  ppIVar4 = (this->Fonts).Data;
  pIVar3 = (this->ConfigData).Data;
  uVar9 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar9;
  }
  for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
    pIVar5 = ppIVar4[uVar9];
    pIVar6 = pIVar5->ConfigData;
    if (pIVar6 < pIVar3 + lVar8 && pIVar3 <= pIVar6) {
      pIVar5->ConfigData = (ImFontConfig *)0x0;
      ppIVar4[uVar9]->ConfigDataCount = 0;
    }
  }
  ImVector<ImFontConfig>::clear(&this->ConfigData);
  ImVector<ImFontAtlasCustomRect>::clear(&this->CustomRects);
  this->PackIdMouseCursors = -1;
  this->PackIdLines = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
    // Important: we leave TexReady untouched
}